

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# part_attr.c
# Opt level: O0

exr_result_t
exr_initialize_required_attr_simple
          (exr_context_t ctxt,int part_index,int32_t width,int32_t height,exr_compression_t ctype)

{
  int iVar1;
  int iVar2;
  exr_result_t eVar3;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  exr_context_t in_RDI;
  exr_lineorder_t in_R8D;
  exr_attr_v2f_t swc;
  exr_attr_box2i_t dispWindow;
  float in_stack_ffffffffffffffcc;
  exr_attr_v2f_t *in_stack_ffffffffffffffd0;
  float pixelaspectratio;
  
  pixelaspectratio = 0.0;
  iVar1 = in_EDX + -1;
  iVar2 = in_ECX + -1;
  memset(&stack0xffffffffffffffd0,0,8);
  eVar3 = exr_initialize_required_attr
                    (in_RDI,in_ESI,(exr_attr_box2i_t *)CONCAT44(in_ECX,in_R8D),
                     (exr_attr_box2i_t *)CONCAT44(iVar2,iVar1),pixelaspectratio,
                     in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc,in_R8D,dispWindow.min.x);
  return eVar3;
}

Assistant:

exr_result_t
exr_initialize_required_attr_simple (
    exr_context_t     ctxt,
    int               part_index,
    int32_t           width,
    int32_t           height,
    exr_compression_t ctype)
{
    exr_attr_box2i_t dispWindow = {
        .min = {.x = 0, .y = 0}, .max = {.x = (width - 1), .y = (height - 1)}};
    exr_attr_v2f_t swc = {.x = 0.f, .y = 0.f};
    return exr_initialize_required_attr (
        ctxt,
        part_index,
        &dispWindow,
        &dispWindow,
        1.f,
        &swc,
        1.f,
        EXR_LINEORDER_INCREASING_Y,
        ctype);
}